

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZROT::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZROT *this,
          ChVector<double> *loc_point,ChState *state_x,ChStateDelta *state_w)

{
  double dVar1;
  double dVar2;
  double s3;
  double s2;
  ChVector<double> A1_dt;
  ChVector<double> A2_dt;
  ChVector<double> local_98;
  ChStateDelta *local_80;
  undefined8 local_78;
  long local_68;
  ChVector<double> A3_dt;
  ChVector<double> local_48;
  
  local_48.m_data[0] = loc_point->m_data[0];
  local_48.m_data[1] = loc_point->m_data[1];
  local_48.m_data[2] = loc_point->m_data[2];
  local_98.m_data[2] = 0.0;
  local_98.m_data._0_16_ = ZEXT816(0) << 0x20;
  collision::utils::PointTriangleDistance
            (&local_48,
             (ChVector<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,&s2,&s3,(bool *)&A1_dt,&local_98);
  dVar2 = s2;
  dVar1 = s3;
  local_98.m_data[0] =
       (double)(state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_68 = (state_w->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_98.m_data[1] = 1.48219693752374e-323;
  local_78 = 0;
  if (2 < local_68) {
    local_80 = state_w;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&A1_dt,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&local_98,(type *)0x0);
    local_68 = (state_w->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_98.m_data[0] =
         (double)((state_w->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 6);
    local_98.m_data[1] = 1.48219693752374e-323;
    local_78 = 6;
    if (8 < local_68) {
      local_80 = state_w;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&A2_dt,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_98,(type *)0x0);
      local_68 = (state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_98.m_data[0] =
           (double)((state_w->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + 0xc);
      local_98.m_data[1] = 1.48219693752374e-323;
      local_78 = 0xc;
      if (0xe < local_68) {
        dVar1 = (1.0 - dVar2) - dVar1;
        local_80 = state_w;
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&A3_dt,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                           *)&local_98,(type *)0x0);
        __return_storage_ptr__->m_data[0] = 0.0;
        __return_storage_ptr__->m_data[1] = 0.0;
        __return_storage_ptr__->m_data[0] =
             dVar1 * A1_dt.m_data[0] + s2 * A2_dt.m_data[0] + s3 * A3_dt.m_data[0];
        __return_storage_ptr__->m_data[1] =
             dVar1 * A1_dt.m_data[1] + s2 * A2_dt.m_data[1] + s3 * A3_dt.m_data[1];
        __return_storage_ptr__->m_data[2] =
             dVar1 * A1_dt.m_data[2] + s2 * A2_dt.m_data[2] + s3 * A3_dt.m_data[2];
        return __return_storage_ptr__;
      }
    }
  }
  local_98.m_data[1] = 1.48219693752374e-323;
  local_80 = state_w;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

ChVector<> ChContactTriangleXYZROT::GetContactPointSpeed(const ChVector<>& loc_point,
                                                         const ChState& state_x,
                                                         const ChStateDelta& state_w) {
    // Note: because the reference coordinate system for a ChContactTriangleXYZROT is the identity,
    // the given point loc_point is actually expressed in the global frame. In this case, we
    // calculate the output point here by assuming that its barycentric coordinates do not change
    // with a change in the states of this object.
    double s2, s3;
    ComputeUVfromP(loc_point, s2, s3);
    double s1 = 1 - s2 - s3;

    ChVector<> A1_dt(state_w.segment(0, 3));
    ChVector<> A2_dt(state_w.segment(6, 3));
    ChVector<> A3_dt(state_w.segment(12, 3));

    return s1 * A1_dt + s2 * A2_dt + s3 * A3_dt;
}